

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void __thiscall Scene::addLight(Scene *this,Light *light)

{
  pointer *pppLVar1;
  iterator __position;
  Light **ppLVar2;
  Light *local_20;
  Light *light_local;
  
  ppLVar2 = (this->lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  __position._M_current =
       (this->lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppLVar2 == __position._M_current) {
      if (__position._M_current ==
          (this->lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_20 = light;
        std::vector<Light*,std::allocator<Light*>>::_M_realloc_insert<Light*const&>
                  ((vector<Light*,std::allocator<Light*>> *)&this->lights,__position,&local_20);
      }
      else {
        *__position._M_current = light;
        pppLVar1 = &(this->lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppLVar1 = *pppLVar1 + 1;
      }
      return;
    }
    if (*ppLVar2 == light) break;
    ppLVar2 = ppLVar2 + 1;
  }
  return;
}

Assistant:

void Scene::addLight(Light * light)
{
	for (Light* l : lights)
	{
		if (l == light)
		{
			return;
		}
	}
	lights.push_back(light);
}